

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mo_lambda.cpp
# Opt level: O3

plural_ptr __thiscall
booster::locale::gnu_gettext::lambda::anon_unknown_0::parser::cond_expr(parser *this)

{
  parser *ppVar1;
  int iVar2;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> _Var3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
  _Var4;
  undefined4 extraout_var_01;
  plural_ptr pVar5;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> _Var6;
  undefined8 *in_RSI;
  int res;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> local_50;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> local_48;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> local_40;
  parser *local_38;
  undefined4 extraout_var_02;
  
  _Var3._M_head_impl = (plural *)l2((parser *)&local_50);
  if ((tokenizer *)local_50._M_head_impl != (tokenizer *)0x0) {
    _Var6._M_head_impl = local_50._M_head_impl;
    local_38 = this;
    while (ppVar1 = local_38, ((tokenizer *)*in_RSI)->next_tocken == 0x107) {
      tokenizer::step((tokenizer *)*in_RSI);
      l2((parser *)&local_50);
      if ((tokenizer *)local_50._M_head_impl == (tokenizer *)0x0) {
        _Var3._M_head_impl = (plural *)0x0;
        this = local_38;
        if ((tokenizer *)_Var6._M_head_impl != (tokenizer *)0x0) {
          iVar2 = (**(code **)(((tokenizer *)_Var6._M_head_impl)->text + 0x18))(_Var6._M_head_impl);
          _Var3._M_head_impl = (plural *)CONCAT44(extraout_var_01,iVar2);
          this = local_38;
        }
        goto LAB_001795d6;
      }
      local_48._M_head_impl = local_50._M_head_impl;
      local_40._M_head_impl = _Var6._M_head_impl;
      _Var3._M_head_impl =
           (plural *)
           bin_factory((anon_unknown_0 *)&local_50,0x107,(plural_ptr *)&local_40,
                       (plural_ptr *)&local_48);
      _Var6._M_head_impl = local_50._M_head_impl;
      if ((tokenizer *)local_48._M_head_impl != (tokenizer *)0x0) {
        _Var3._M_head_impl._0_4_ = (*(local_48._M_head_impl)->_vptr_plural[3])();
        _Var3._M_head_impl._4_4_ = extraout_var;
      }
      local_48._M_head_impl = (plural *)0x0;
      if ((tokenizer *)local_40._M_head_impl != (tokenizer *)0x0) {
        iVar2 = (*(local_40._M_head_impl)->_vptr_plural[3])();
        _Var3._M_head_impl = (plural *)CONCAT44(extraout_var_00,iVar2);
      }
      local_40._M_head_impl = (plural *)0x0;
    }
    this = local_38;
    if ((tokenizer *)_Var6._M_head_impl != (tokenizer *)0x0) {
      if (((tokenizer *)*in_RSI)->next_tocken != 0x3f) {
        local_38->t = (tokenizer *)_Var6._M_head_impl;
        return (plural_ptr)_Var3._M_head_impl;
      }
      tokenizer::step((tokenizer *)*in_RSI);
      cond_expr((parser *)&local_50);
      _Var3._M_head_impl = local_50._M_head_impl;
      if ((tokenizer *)local_50._M_head_impl == (tokenizer *)0x0) {
        ppVar1->t = (tokenizer *)0x0;
      }
      else {
        iVar2 = ((tokenizer *)*in_RSI)->next_tocken;
        tokenizer::step((tokenizer *)*in_RSI);
        if ((iVar2 == 0x3a) &&
           (cond_expr((parser *)&local_50), (tokenizer *)local_50._M_head_impl != (tokenizer *)0x0))
        {
          _Var4.
          super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
          ._M_t.
          super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
          .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>._M_head_impl
               = (__uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                  )operator_new(0x20);
          *(undefined ***)
           _Var4.
           super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
           ._M_t.
           super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
           .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>.
           _M_head_impl = &PTR_operator___001d0580;
          *(plural **)
           ((long)_Var4.
                  super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                  .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>.
                  _M_head_impl + 8) = _Var6._M_head_impl;
          *(plural **)
           ((long)_Var4.
                  super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                  .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>.
                  _M_head_impl + 0x10) = _Var3._M_head_impl;
          *(plural **)
           ((long)_Var4.
                  super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                  .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>.
                  _M_head_impl + 0x18) = local_50._M_head_impl;
          ppVar1->t = (tokenizer *)
                      _Var4.
                      super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                      .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>.
                      _M_head_impl;
          return (__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
                  )(tuple<booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                    )_Var4.
                     super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                     .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>.
                     _M_head_impl;
        }
        ppVar1->t = (tokenizer *)0x0;
        (*(_Var3._M_head_impl)->_vptr_plural[3])(_Var3._M_head_impl);
      }
      pVar5._M_t.
      super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
      ._M_t.
      super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
      .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>._M_head_impl.
      _0_4_ = (**(code **)(((tokenizer *)_Var6._M_head_impl)->text + 0x18))(_Var6._M_head_impl);
      pVar5._M_t.
      super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
      ._M_t.
      super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
      .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>._M_head_impl.
      _4_4_ = extraout_var_02;
      return (plural_ptr)
             pVar5._M_t.
             super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
             ._M_t.
             super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
             .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>.
             _M_head_impl;
    }
  }
LAB_001795d6:
  this->t = (tokenizer *)0x0;
  return (__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
          )(tuple<booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
            )_Var3._M_head_impl;
}

Assistant:

plural_ptr cond_expr()
        {
            plural_ptr cond,case1,case2;
            if((cond=l1()).get()==0)
                return plural_ptr();
            if(t.next()=='?') {
                t.get();
                if((case1=cond_expr()).get()==0)
                    return plural_ptr();
                if(t.get()!=':')
                    return plural_ptr();
                if((case2=cond_expr()).get()==0)
                    return plural_ptr();
            }
            else {
                return cond;
            }
            return plural_ptr(new conditional(std::move(cond),std::move(case1),std::move(case2)));
        }